

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

bool Js::JavascriptStringHelpers<JITJavascriptString>::Equals
               (JITJavascriptString *aLeft,JITJavascriptString *aRight)

{
  charcount_t cVar1;
  charcount_t cVar2;
  char16 *s1;
  char16 *s2;
  anon_class_16_2_0ee458fc keepAliveLambda;
  JITJavascriptString **keepAliveRightString;
  JITJavascriptString **keepAliveLeftString;
  JITJavascriptString *aRight_local;
  JITJavascriptString *aLeft_local;
  
  if (aLeft == aRight) {
    aLeft_local._7_1_ = true;
  }
  else {
    keepAliveLambda.keepAliveRightString = &keepAliveLeftString;
    keepAliveLambda.keepAliveLeftString =
         (JITJavascriptString ***)&keepAliveLambda.keepAliveRightString;
    keepAliveLeftString = (JITJavascriptString **)aRight;
    aRight_local = aLeft;
    cVar1 = JITJavascriptString::GetLength(aLeft);
    cVar2 = JITJavascriptString::GetLength((JITJavascriptString *)keepAliveLeftString);
    if (cVar1 == cVar2) {
      s1 = JITJavascriptString::GetString(aRight_local);
      s2 = JITJavascriptString::GetString((JITJavascriptString *)keepAliveLeftString);
      cVar1 = JITJavascriptString::GetLength(aRight_local);
      aLeft_local._7_1_ = JsUtil::CharacterBuffer<char16_t>::StaticEquals(s1,s2,cVar1);
    }
    else {
      aLeft_local._7_1_ = false;
    }
  }
  return aLeft_local._7_1_;
}

Assistant:

bool JavascriptStringHelpers<T>::Equals(T* aLeft, T* aRight)
    {
        if (aLeft == aRight) return true;

        // methods could get called a lot of times this can show up as regressions in benchmarks.
        volatile T** keepAliveLeftString = (volatile T**)& aLeft;
        volatile T** keepAliveRightString = (volatile T**)& aRight;
        auto keepAliveLambda = [&]() {
            UNREFERENCED_PARAMETER(keepAliveLeftString);
            UNREFERENCED_PARAMETER(keepAliveRightString);
        };

        if (aLeft->GetLength() != aRight->GetLength())
        {
            return false;
        }

        return JsUtil::CharacterBuffer<char16>::StaticEquals(aLeft->GetString(), aRight->GetString(), aLeft->GetLength());
    }